

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCustomLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  int iVar1;
  bool bVar2;
  undefined1 *puVar3;
  Result *_result;
  long lVar4;
  InternalMetadata *pIVar5;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  validateInputCount(__return_storage_ptr__,layer,1,-1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
    validateOutputCount(__return_storage_ptr__,layer,1,-1);
    bVar2 = Result::good(__return_storage_ptr__);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
      if (layer->_oneof_case_[0] == 500) {
        puVar3 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar3 = Specification::_CustomLayerParams_default_instance_;
      }
      if (*(long *)(((ulong)((GRULayerParams *)puVar3)->updategatebiasvector_ & 0xfffffffffffffffe)
                   + 8) == 0) {
        std::operator+(&local_48,"Custom layer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&err,&local_48,
                       " has an empty \'className\' field. This field is required in order for Core ML to link to the implementation for this custom class."
                      );
        std::__cxx11::string::~string((string *)&local_48);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      else {
        pIVar5 = &(((BatchnormLayerParams *)puVar3)->mean_->super_MessageLite)._internal_metadata_;
        if (((BatchnormLayerParams *)puVar3)->mean_ == (WeightParams *)0x0) {
          pIVar5 = (InternalMetadata *)0x0;
        }
        iVar1 = *(int *)&(((ConvolutionLayerParams *)puVar3)->kernelsize_).arena_or_elements_;
        lVar4 = 0;
        do {
          if ((long)iVar1 * 8 == lVar4) {
            Result::Result(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          bVar2 = checkSingleWeightType(*(WeightParams **)((long)&pIVar5->ptr_ + lVar4));
          lVar4 = lVar4 + 8;
        } while (bVar2);
        std::operator+(&local_48,"Custom layer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&err,&local_48,
                       " has a weights parameter with multiple types filled in.  The WeightParams message should be treated as a oneof."
                      );
        std::__cxx11::string::~string((string *)&local_48);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      std::__cxx11::string::~string((string *)&err);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCustomLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, -1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, -1));

    if (layer.custom().classname().size() == 0) {
        std::string err = "Custom layer " + layer.name() + " has an empty 'className' field. This field is required in order for Core ML to link to the implementation for this custom class.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    for (const auto& param: layer.custom().weights()) {
        if (!checkSingleWeightType(param)) {
            std::string err = "Custom layer " + layer.name() + " has a weights parameter with multiple types filled in.  The WeightParams message should be treated as a oneof.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return Result();
}